

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O0

_Bool borg_flow_recover(_Bool viewable,wchar_t dist)

{
  loc grid1;
  chunk_conflict *c;
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict grid;
  loc grid2;
  wchar_t local_1c;
  wchar_t local_18;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  wchar_t dist_local;
  _Bool viewable_local;
  
  if (borg.time_this_panel < 0x1f5) {
    if (borg.trait[0x23] < 6) {
      i._3_1_ = false;
    }
    else {
      _Var1 = borg_primarily_caster();
      if (_Var1) {
        if (((borg.trait[0x1c] / 3 < borg.trait[0x1b]) &&
            (((borg.trait[0x1f] / 4 < borg.trait[0x1e] || (borg.trait[0x1f] == 0)) &&
             (borg.trait[0x74] == 0)))) &&
           (((borg.trait[0x75] == 0 && (borg.trait[0x76] == 0)) && (borg.trait[0x71] == 0)))) {
          return false;
        }
      }
      else if (((borg.trait[0x1c] / 3 < borg.trait[0x1b]) && (borg.trait[0x74] == 0)) &&
              ((borg.trait[0x75] == 0 && ((borg.trait[0x76] == 0 && (borg.trait[0x71] == 0)))))) {
        return false;
      }
      if ((borg.goal.fleeing & 1U) == 0) {
        if (((borg.lunal_mode & 1U) == 0) && ((borg.munchkin_mode & 1U) == 0)) {
          if (borg.trait[0x6d] == 0) {
            borg_temp_n = 0;
            for (local_1c = borg.c.y + L'\xffffffe7'; local_1c < borg.c.y + L'\x19';
                local_1c = local_1c + L'\x01') {
              for (local_18 = borg.c.x + L'\xffffffe7'; c = cave, local_18 < borg.c.x + L'\x19';
                  local_18 = local_18 + L'\x01') {
                grid = (loc_conflict)loc(local_18,local_1c);
                _Var1 = square_in_bounds((chunk *)c,grid);
                if ((_Var1) && ((local_1c != borg.c.y || (local_18 != borg.c.x)))) {
                  grid2 = loc(local_18,local_1c);
                  grid1.y = borg.c.y;
                  grid1.x = borg.c.x;
                  wVar2 = distance(grid1,grid2);
                  if ((L'\x06' < wVar2) &&
                     ((_Var1 = borg_happy_grid_bold(local_1c,local_18), _Var1 &&
                      (((borg_grids[local_1c][local_18].feat < 0xf ||
                        (borg_grids[local_1c][local_18].feat == '\x18')) &&
                       (_Var1 = borg_check_rest(local_1c,local_18), _Var1)))))) {
                    borg_temp_x[borg_temp_n] = (uint8_t)local_18;
                    borg_temp_y[borg_temp_n] = (uint8_t)local_1c;
                    borg_temp_n = borg_temp_n + 1;
                  }
                }
              }
            }
            if (borg_temp_n == 0) {
              i._3_1_ = false;
            }
            else {
              borg_flow_clear();
              for (y = L'\0'; y < borg_temp_n; y = y + L'\x01') {
                borg_flow_enqueue_grid((uint)borg_temp_y[y],(uint)borg_temp_x[y]);
              }
              borg_flow_spread(dist,false,true,false,L'\xffffffff',false);
              _Var1 = borg_flow_commit("Recover Grid",L'\t');
              if (_Var1) {
                _Var1 = borg_flow_old(L'\t');
                if (_Var1) {
                  i._3_1_ = true;
                }
                else {
                  i._3_1_ = false;
                }
              }
              else {
                i._3_1_ = false;
              }
            }
          }
          else {
            i._3_1_ = false;
          }
        }
        else {
          i._3_1_ = false;
        }
      }
      else {
        i._3_1_ = false;
      }
    }
  }
  else {
    i._3_1_ = false;
  }
  return i._3_1_;
}

Assistant:

bool borg_flow_recover(bool viewable, int dist)
{
    int i, x, y;

    /* Sometimes we loop on this */
    if (borg.time_this_panel > 500)
        return false;

    /* No retreating and recovering when low level */
    if (borg.trait[BI_CLEVEL] <= 5)
        return false;

    /* Mana for spell casters */
    if (borg_primarily_caster()) {
        if (borg.trait[BI_CURHP] > borg.trait[BI_MAXHP] / 3
            && ((borg.trait[BI_CURSP] > borg.trait[BI_MAXSP] / 4)
                || borg.trait[BI_MAXSP] == 0)
            && /* Non spell casters? */
            !borg.trait[BI_ISCUT] && !borg.trait[BI_ISSTUN]
            && !borg.trait[BI_ISHEAVYSTUN] && !borg.trait[BI_ISAFRAID])
            return false;
    } else /* Non Spell Casters */
    {
        /* do I need to recover some? */
        if (borg.trait[BI_CURHP] > borg.trait[BI_MAXHP] / 3
            && !borg.trait[BI_ISCUT] && !borg.trait[BI_ISSTUN]
            && !borg.trait[BI_ISHEAVYSTUN] && !borg.trait[BI_ISAFRAID])
            return false;
    }

    /* If Fleeing, then do not rest */
    if (borg.goal.fleeing)
        return false;

    /* If Scumming, then do not rest */
    if (borg.lunal_mode || borg.munchkin_mode)
        return false;

    /* No need if hungry */
    if (borg.trait[BI_ISHUNGRY])
        return false;

    /* Nothing found */
    borg_temp_n = 0;

    /* Scan some known Grids
     * Favor the following types of grids:
     * 1. Happy grids
     */

    /* look at grids within 20 grids of me */
    for (y = borg.c.y - 25; y < borg.c.y + 25; y++) {

        for (x = borg.c.x - 25; x < borg.c.x + 25; x++) {
            /* Stay in bounds */
            if (!square_in_bounds(cave, loc(x, y)))
                continue;

            /* Skip my own grid */
            if (y == borg.c.y && x == borg.c.x)
                continue;

            /* Skip grids that are too close to me */
            if (distance(borg.c, loc(x, y)) < 7)
                continue;

            /* Is this grid a happy grid? */
            if (!borg_happy_grid_bold(y, x))
                continue;

            /* Can't rest on a wall grid. */
            /* HACK depends on FEAT order, kinda evil */
            if (borg_grids[y][x].feat >= FEAT_SECRET
                && borg_grids[y][x].feat != FEAT_PASS_RUBBLE)
                continue;

            /* Can I rest on that one? */
            if (!borg_check_rest(y, x))
                continue;

            /* Careful -- Remember it */
            borg_temp_x[borg_temp_n] = x;
            borg_temp_y[borg_temp_n] = y;
            borg_temp_n++;
        }
    }

    /* Nothing to kill */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look through the good grids */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    borg_flow_spread(dist, false, true, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Recover Grid", GOAL_RECOVER))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_RECOVER))
        return false;

    return true;
}